

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (column_index < 0) {
    column_index = (pIVar1->DC).ColumnsCurrent;
  }
  if ((GImGui->ActiveId == 0) || (GImGui->ActiveId != (pIVar1->DC).ColumnsSetId + column_index)) {
    if (column_index < (pIVar1->DC).ColumnsData.Size) {
      fVar6 = (pIVar1->DC).ColumnsMinX;
      return (float)(int)(((pIVar1->DC).ColumnsMaxX - fVar6) *
                          (pIVar1->DC).ColumnsData.Data[column_index].OffsetNorm + fVar6);
    }
    __assert_fail("column_index < window->DC.ColumnsData.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x2468,"float ImGui::GetColumnOffset(int)");
  }
  if (column_index < 1) {
    __assert_fail("column_index > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x2451,"float GetDraggedColumnOffset(int)");
  }
  if (GImGui->ActiveId == (GImGui->CurrentWindow->DC).ColumnsSetId + column_index) {
    fVar4 = ((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) -
            (GImGui->CurrentWindow->Pos).x;
    fVar5 = GetColumnOffset(column_index + -1);
    fVar5 = fVar5 + (pIVar2->Style).ColumnsMinSpacing;
    fVar6 = GetColumnOffset(column_index + 1);
    fVar6 = fVar6 - (pIVar2->Style).ColumnsMinSpacing;
    if (fVar4 <= fVar6) {
      fVar6 = fVar4;
    }
    uVar3 = -(uint)(fVar4 < fVar5);
    return (float)(int)(float)(uVar3 & (uint)fVar5 | ~uVar3 & (uint)fVar6);
  }
  __assert_fail("g.ActiveId == window->DC.ColumnsSetId + ImGuiID(column_index)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x2452,"float GetDraggedColumnOffset(int)");
}

Assistant:

float ImGui::GetColumnOffset(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    if (g.ActiveId)
    {
        const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
        if (g.ActiveId == column_id)
            return GetDraggedColumnOffset(column_index);
    }

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);
    const float t = window->DC.ColumnsData[column_index].OffsetNorm;
    const float x_offset = window->DC.ColumnsMinX + t * (window->DC.ColumnsMaxX - window->DC.ColumnsMinX);
    return (float)(int)x_offset;
}